

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteConstant<duckdb::interval_t,duckdb::dtime_tz_t,duckdb::dtime_tz_t,duckdb::BinaryLambdaWrapper,bool,duckdb::dtime_tz_t(*)(duckdb::interval_t,duckdb::dtime_tz_t)>
               (Vector *left,Vector *right,Vector *result,
               _func_dtime_tz_t_interval_t_dtime_tz_t *fun)

{
  interval_t left_00;
  bool bVar1;
  interval_t *piVar2;
  dtime_tz_t *pdVar3;
  dtime_tz_t right_00;
  dtime_tz_t dVar4;
  Vector *in_RDX;
  dtime_tz_t *result_data;
  dtime_tz_t *rdata;
  interval_t *ldata;
  idx_t idx;
  ValidityMask *mask;
  _func_dtime_tz_t_interval_t_dtime_tz_t *in_stack_ffffffffffffffc0;
  
  duckdb::Vector::SetVectorType((VectorType)in_RDX);
  piVar2 = ConstantVector::GetData<duckdb::interval_t>((Vector *)0xce9a71);
  pdVar3 = ConstantVector::GetData<duckdb::dtime_tz_t>((Vector *)0xce9a80);
  right_00.bits = (uint64_t)ConstantVector::GetData<duckdb::dtime_tz_t>((Vector *)0xce9a8f);
  bVar1 = ConstantVector::IsNull((Vector *)0xce9a9e);
  if ((!bVar1) && (bVar1 = ConstantVector::IsNull((Vector *)0xce9aac), !bVar1)) {
    idx._0_4_ = piVar2->months;
    idx._4_4_ = piVar2->days;
    mask = (ValidityMask *)piVar2->micros;
    ConstantVector::Validity(in_RDX);
    left_00.micros = (int64_t)piVar2;
    left_00._0_8_ = pdVar3;
    dVar4 = BinaryLambdaWrapper::
            Operation<duckdb::dtime_tz_t(*)(duckdb::interval_t,duckdb::dtime_tz_t),bool,duckdb::interval_t,duckdb::dtime_tz_t,duckdb::dtime_tz_t>
                      (in_stack_ffffffffffffffc0,left_00,right_00,mask,idx);
    *(uint64_t *)right_00.bits = dVar4.bits;
    return;
  }
  duckdb::ConstantVector::SetNull(in_RDX,true);
  return;
}

Assistant:

static void ExecuteConstant(Vector &left, Vector &right, Vector &result, FUNC fun) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);

		auto ldata = ConstantVector::GetData<LEFT_TYPE>(left);
		auto rdata = ConstantVector::GetData<RIGHT_TYPE>(right);
		auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);

		if (ConstantVector::IsNull(left) || ConstantVector::IsNull(right)) {
			ConstantVector::SetNull(result, true);
			return;
		}
		*result_data = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
		    fun, *ldata, *rdata, ConstantVector::Validity(result), 0);
	}